

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

aiQuaternion Read<aiQuaterniont<float>>(IOStream *stream)

{
  float fVar1;
  float fVar2;
  float fVar3;
  aiQuaternion aVar4;
  
  aVar4.w = Read<float>(stream);
  fVar1 = Read<float>(stream);
  fVar2 = Read<float>(stream);
  fVar3 = Read<float>(stream);
  aVar4.z = fVar3;
  aVar4.y = fVar2;
  aVar4.x = fVar1;
  return aVar4;
}

Assistant:

aiQuaternion Read<aiQuaternion>(IOStream * stream) {
    aiQuaternion v;
    v.w = Read<float>(stream);
    v.x = Read<float>(stream);
    v.y = Read<float>(stream);
    v.z = Read<float>(stream);
    return v;
}